

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O3

void test_bson_iter_as_bool(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  ulong uVar4;
  bson_t *pbVar5;
  bson_t *pbVar6;
  TestSuite *suite;
  bson_t *pbVar7;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_1518 [4104];
  bson_t *pbStack_510;
  code *pcStack_508;
  undefined8 uStack_490;
  undefined1 uStack_488;
  TestSuite aTStack_480 [5];
  code *pcStack_388;
  int *piStack_310;
  int iStack_308;
  undefined1 auStack_304 [4];
  undefined1 auStack_300 [232];
  bson_t *pbStack_218;
  undefined1 *puStack_210;
  code *pcStack_208;
  bson_t bStack_200;
  bson_t local_180 [2];
  
  pbVar5 = &bStack_200;
  pbVar6 = &bStack_200;
  pbVar7 = &bStack_200;
  pbVar3 = local_180;
  pcStack_208 = (code *)0x12bb15;
  bson_init(pbVar3);
  pcStack_208 = (code *)0x12bb2e;
  bson_append_int32(pbVar3,"int32[true]",0xffffffff,1);
  pcStack_208 = (code *)0x12bb44;
  bson_append_int32(pbVar3,"int32[false]",0xffffffff,0);
  pcStack_208 = (code *)0x12bb60;
  bson_append_int64(pbVar3,"int64[true]",0xffffffff,1);
  pcStack_208 = (code *)0x12bb79;
  bson_append_int64(pbVar3,"int64[false]",0xffffffff,0);
  pcStack_208 = (code *)0x12bb91;
  bson_append_double(0x3ff0000000000000,pbVar3,"int64[true]",0xffffffff);
  pcStack_208 = (code *)0x12bba4;
  bson_append_double(0,pbVar3,"int64[false]",0xffffffff);
  pcStack_208 = (code *)0x12bbb2;
  bson_iter_init(&bStack_200,pbVar3);
  pcStack_208 = (code *)0x12bbba;
  bson_iter_next(&bStack_200);
  pcStack_208 = (code *)0x12bbc2;
  cVar1 = bson_iter_as_bool(&bStack_200);
  if (cVar1 == '\0') {
    pcStack_208 = (code *)0x12bc5a;
    test_bson_iter_as_bool_cold_1();
LAB_0012bc5a:
    pcStack_208 = (code *)0x12bc5f;
    test_bson_iter_as_bool_cold_6();
LAB_0012bc5f:
    pbVar5 = pbVar3;
    pcStack_208 = (code *)0x12bc64;
    test_bson_iter_as_bool_cold_2();
LAB_0012bc64:
    pcStack_208 = (code *)0x12bc69;
    test_bson_iter_as_bool_cold_5();
LAB_0012bc69:
    pbVar6 = pbVar5;
    pcStack_208 = (code *)0x12bc6e;
    test_bson_iter_as_bool_cold_3();
  }
  else {
    pcStack_208 = (code *)0x12bbd5;
    bson_iter_next(&bStack_200);
    pcStack_208 = (code *)0x12bbdd;
    cVar1 = bson_iter_as_bool(&bStack_200);
    pbVar3 = &bStack_200;
    if (cVar1 != '\0') goto LAB_0012bc5a;
    pcStack_208 = (code *)0x12bbec;
    bson_iter_next(&bStack_200);
    pcStack_208 = (code *)0x12bbf4;
    cVar1 = bson_iter_as_bool(&bStack_200);
    pbVar3 = &bStack_200;
    if (cVar1 == '\0') goto LAB_0012bc5f;
    pcStack_208 = (code *)0x12bc03;
    bson_iter_next(&bStack_200);
    pcStack_208 = (code *)0x12bc0b;
    cVar1 = bson_iter_as_bool(&bStack_200);
    if (cVar1 != '\0') goto LAB_0012bc64;
    pcStack_208 = (code *)0x12bc1a;
    bson_iter_next(&bStack_200);
    pcStack_208 = (code *)0x12bc22;
    cVar1 = bson_iter_as_bool(&bStack_200);
    pbVar5 = &bStack_200;
    if (cVar1 == '\0') goto LAB_0012bc69;
    pcStack_208 = (code *)0x12bc31;
    bson_iter_next(&bStack_200);
    pcStack_208 = (code *)0x12bc39;
    cVar1 = bson_iter_as_bool(&bStack_200);
    if (cVar1 == '\0') {
      pcStack_208 = (code *)0x12bc4a;
      bson_destroy(local_180);
      return;
    }
  }
  pcStack_208 = test_bson_iter_binary_deprecated;
  test_bson_iter_as_bool_cold_4();
  pcStack_388 = (code *)0x12bc91;
  pbStack_218 = pbVar6;
  puStack_210 = (undefined1 *)&bStack_200;
  pcStack_208 = (code *)&stack0xfffffffffffffff8;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                   );
  if (pbVar3 == (bson_t *)0x0) {
    pcStack_388 = (code *)0x12bd06;
    test_bson_iter_binary_deprecated_cold_5();
LAB_0012bd06:
    pcStack_388 = (code *)0x12bd0b;
    test_bson_iter_binary_deprecated_cold_1();
LAB_0012bd0b:
    pcStack_388 = (code *)0x12bd10;
    test_bson_iter_binary_deprecated_cold_2();
LAB_0012bd10:
    pcStack_388 = (code *)0x12bd15;
    test_bson_iter_binary_deprecated_cold_3();
  }
  else {
    pcStack_388 = (code *)0x12bca9;
    cVar1 = bson_iter_init(auStack_300,pbVar3);
    pbVar6 = pbVar3;
    if (cVar1 == '\0') goto LAB_0012bd06;
    pcStack_388 = (code *)0x12bcba;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012bd0b;
    pbVar7 = (bson_t *)&iStack_308;
    pcStack_388 = (code *)0x12bcdd;
    bson_iter_binary(auStack_300,auStack_304,pbVar7,&piStack_310);
    if (iStack_308 != 4) goto LAB_0012bd10;
    if (*piStack_310 == 0x34333231) {
      pcStack_388 = (code *)0x12bcf8;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_388 = test_bson_iter_from_data;
  test_bson_iter_binary_deprecated_cold_4();
  uStack_490 = 0x100620800000009;
  uStack_488 = 0;
  suite = aTStack_480;
  pcStack_508 = (code *)0x12bd51;
  pcStack_388 = (code *)&pcStack_208;
  cVar1 = bson_iter_init_from_data(suite,&uStack_490,9);
  if (cVar1 == '\0') {
    pcStack_508 = (code *)0x12bd93;
    test_bson_iter_from_data_cold_1();
LAB_0012bd93:
    pcStack_508 = (code *)0x12bd98;
    test_bson_iter_from_data_cold_2();
LAB_0012bd98:
    pcStack_508 = (code *)0x12bd9d;
    test_bson_iter_from_data_cold_3();
  }
  else {
    suite = aTStack_480;
    pcStack_508 = (code *)0x12bd62;
    cVar1 = bson_iter_next();
    if (cVar1 == '\0') goto LAB_0012bd93;
    suite = aTStack_480;
    pcStack_508 = (code *)0x12bd73;
    iVar2 = bson_iter_type();
    if (iVar2 != 8) goto LAB_0012bd98;
    suite = aTStack_480;
    pcStack_508 = (code *)0x12bd85;
    cVar1 = bson_iter_bool();
    if (cVar1 != '\0') {
      return;
    }
  }
  pcStack_508 = get_bson;
  test_bson_iter_from_data_cold_4();
  pbStack_510 = pbVar6;
  pcStack_508 = (code *)pbVar7;
  iVar2 = open((char *)suite,0);
  if (iVar2 != -1) {
    uVar4 = read(iVar2,auStack_1518,0x1000);
    if ((long)uVar4 < 0) goto LAB_0012be04;
    if (uVar4 != 0) {
      bson_new_from_data(auStack_1518,uVar4 & 0xffffffff);
      close(iVar2);
      return;
    }
    get_bson_cold_1();
  }
  get_bson_cold_3();
LAB_0012be04:
  get_bson_cold_2();
  TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
  TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
  TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
  TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
  TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
  TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
  TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
  TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
  TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
  TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
  TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
  TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
  TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                test_bson_as_canonical_extended_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
  TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
  TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
  TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
  TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
  TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
  TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
  TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
  TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
  TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
  TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
  TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
  TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
  TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
  TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
  TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
  TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
  TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
  TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
  TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
  TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
  TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
  TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
  TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
  TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
  TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
  TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
  TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
  TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
  TestSuite_Add(suite,"/bson/json/read/regex_options_order",test_bson_json_read_regex_options_order)
  ;
  TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
  TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
  TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
  TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
  TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
  TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
  TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
  TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
  TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
  TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
  TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
  TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
  TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
  TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
  TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
  TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
  TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
  TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
  TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
  TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
  TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
  TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
  TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
  TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
  TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
  TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
  return;
}

Assistant:

static void
test_bson_iter_as_bool (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   bson_append_int32 (&b, "int32[true]", -1, 1);
   bson_append_int32 (&b, "int32[false]", -1, 0);
   bson_append_int64 (&b, "int64[true]", -1, 1);
   bson_append_int64 (&b, "int64[false]", -1, 0);
   bson_append_double (&b, "int64[true]", -1, 1.0);
   bson_append_double (&b, "int64[false]", -1, 0.0);

   bson_iter_init (&iter, &b);
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (true, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (false, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (true, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (false, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (true, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (false, ==, bson_iter_as_bool (&iter));

   bson_destroy (&b);
}